

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Fill_patch64(int g_a,int64_t *lo,int64_t *hi,void *val)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer in_stack_00000140;
  void *in_stack_000003d8;
  Integer *in_stack_000003e0;
  Integer *in_stack_000003e8;
  Integer in_stack_000003f0;
  int local_b0;
  int local_ac;
  long local_a8 [8];
  long local_68 [7];
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_28 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000140);
  for (local_ac = 0; local_ac < local_30; local_ac = local_ac + 1) {
    local_68[(local_30 - local_ac) + -1] = *(long *)(local_10 + (long)local_ac * 8) + 1;
  }
  for (local_b0 = 0; local_b0 < local_30; local_b0 = local_b0 + 1) {
    local_a8[(local_30 - local_b0) + -1] = *(long *)(local_18 + (long)local_b0 * 8) + 1;
  }
  pnga_fill_patch(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
  return;
}

Assistant:

void NGA_Fill_patch64(int g_a, int64_t lo[], int64_t hi[], void *val)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);

    wnga_fill_patch(a, _ga_lo, _ga_hi, val);
}